

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# katajainen.c
# Opt level: O1

int ZopfliLengthLimitedCodeLengths(size_t *frequencies,int n,int maxbits,uint *bitlengths)

{
  ulong *puVar1;
  Node *leaves;
  ulong uVar2;
  Node *pNVar3;
  Node *(*lists) [2];
  long *plVar4;
  ulong uVar5;
  long lVar6;
  NodePool NVar7;
  int iVar8;
  int iVar9;
  Node *pNVar10;
  ulong uVar11;
  int *piVar12;
  uint uVar13;
  uint uVar14;
  NodePool pool;
  int counts [16];
  NodePool local_88;
  undefined8 local_80;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  ulong uStack_40;
  
  leaves = (Node *)malloc((long)n * 0x18);
  if (n < 1) {
    uVar13 = 0;
  }
  else {
    memset(bitlengths,0,(ulong)(uint)n * 4);
    uVar2 = 0;
    uVar13 = 0;
    do {
      if (frequencies[uVar2] != 0) {
        leaves[(int)uVar13].weight = frequencies[uVar2];
        leaves[(int)uVar13].count = (int)uVar2;
        uVar13 = uVar13 + 1;
      }
      uVar2 = uVar2 + 1;
    } while ((uint)n != uVar2);
  }
  iVar9 = 1;
  if ((int)uVar13 <= 1 << ((byte)maxbits & 0x1f)) {
    if (uVar13 == 2) {
      bitlengths[leaves->count] = bitlengths[leaves->count] + 1;
      bitlengths[leaves[1].count] = bitlengths[leaves[1].count] + 1;
    }
    else {
      if (uVar13 != 1) {
        if (uVar13 == 0) {
          iVar9 = 0;
        }
        else {
          if (0 < (int)uVar13) {
            lVar6 = 0;
            do {
              uVar2 = *(ulong *)((long)&leaves->weight + lVar6);
              if (uVar2 >> 0x37 != 0) goto LAB_001089da;
              *(ulong *)((long)&leaves->weight + lVar6) =
                   (long)*(int *)((long)&leaves->count + lVar6) | uVar2 << 9;
              lVar6 = lVar6 + 0x18;
            } while ((ulong)uVar13 * 0x18 != lVar6);
          }
          qsort(leaves,(long)(int)uVar13,0x18,LeafComparator);
          if (0 < (int)uVar13) {
            lVar6 = 0;
            do {
              puVar1 = (ulong *)((long)&leaves->weight + lVar6);
              *puVar1 = *puVar1 >> 9;
              lVar6 = lVar6 + 0x18;
            } while ((ulong)uVar13 * 0x18 != lVar6);
          }
          uVar14 = uVar13 - 1;
          if (maxbits < (int)uVar13) {
            uVar14 = maxbits;
          }
          pNVar3 = (Node *)malloc((long)(int)(uVar13 * uVar14 * 2) * 0x18);
          local_80 = (long)(int)uVar14 << 4;
          local_88.next = pNVar3;
          lists = (Node *(*) [2])malloc(local_80);
          local_88.next = pNVar3 + 2;
          pNVar3->weight = leaves->weight;
          pNVar3->count = 1;
          pNVar3->tail = (Node *)0x0;
          pNVar3[1].weight = leaves[1].weight;
          pNVar3[1].count = 2;
          pNVar3[1].tail = (Node *)0x0;
          if (0 < (int)uVar14) {
            lVar6 = 0;
            do {
              *(Node **)((long)*lists + lVar6) = pNVar3;
              *(Node **)((long)*lists + lVar6 + 8) = pNVar3 + 1;
              lVar6 = lVar6 + 0x10;
            } while ((ulong)uVar14 << 4 != lVar6);
          }
          if (2 < (int)uVar13) {
            iVar9 = uVar13 * 2 + -5;
            iVar8 = 1;
            if (1 < iVar9) {
              iVar8 = iVar9;
            }
            do {
              BoundaryPM(lists,leaves,uVar13,&local_88,uVar14 - 1);
              iVar8 = iVar8 + -1;
            } while (iVar8 != 0);
          }
          plVar4 = (long *)((long)lists[-1] + local_80 + 8);
          NVar7.next = *(Node **)((long)lists[-1] + local_80 + 8);
          iVar9 = (NVar7.next)->count;
          if ((iVar9 < (int)uVar13) &&
             (leaves[iVar9].weight <
              (ulong)(**(long **)((long)lists[-2] + local_80 + 8) +
                     **(long **)((long)lists[-2] + local_80)))) {
            pNVar10 = (NVar7.next)->tail;
            *plVar4 = (long)local_88.next;
            (local_88.next)->count = iVar9 + 1;
            NVar7.next = local_88.next;
          }
          else {
            pNVar10 = *(Node **)((long)lists[-2] + local_80 + 8);
          }
          (NVar7.next)->tail = pNVar10;
          lVar6 = *plVar4;
          local_48 = 0;
          uStack_40 = 0;
          local_58 = 0;
          uStack_50 = 0;
          local_68 = 0;
          uStack_60 = 0;
          local_78 = 0;
          uStack_70 = 0;
          uVar2 = 0x10;
          for (; lVar6 != 0; lVar6 = *(long *)(lVar6 + 8)) {
            uVar2 = (ulong)((uint)uVar2 - 1);
            *(undefined4 *)((long)&local_78 + uVar2 * 4) = *(undefined4 *)(lVar6 + 0x10);
          }
          if ((uint)uVar2 < 0x10) {
            uVar5 = uStack_40 >> 0x20;
            uVar13 = 1;
            uVar11 = 0xf;
            do {
              iVar9 = *(int *)((long)&local_80 + uVar11 * 4 + 4);
              if (iVar9 < (int)uVar5) {
                uVar5 = (ulong)(int)uVar5;
                piVar12 = &leaves[uVar5 - 1].count;
                do {
                  bitlengths[*piVar12] = uVar13;
                  uVar5 = uVar5 - 1;
                  piVar12 = piVar12 + -6;
                } while ((long)iVar9 < (long)uVar5);
              }
              uVar11 = uVar11 - 1;
              uVar13 = uVar13 + 1;
            } while (uVar2 <= uVar11);
          }
          free(lists);
          free(leaves);
          iVar9 = 0;
          leaves = pNVar3;
        }
        goto LAB_001089da;
      }
      bitlengths[leaves->count] = 1;
    }
    iVar9 = 0;
  }
LAB_001089da:
  free(leaves);
  return iVar9;
}

Assistant:

int ZopfliLengthLimitedCodeLengths(
    const size_t* frequencies, int n, int maxbits, unsigned* bitlengths) {
  NodePool pool;
  int i;
  int numsymbols = 0;  /* Amount of symbols with frequency > 0. */
  int numBoundaryPMRuns;
  Node* nodes;

  /* Array of lists of chains. Each list requires only two lookahead chains at
  a time, so each list is a array of two Node*'s. */
  Node* (*lists)[2];

  /* One leaf per symbol. Only numsymbols leaves will be used. */
  Node* leaves = (Node*)malloc(n * sizeof(*leaves));

  /* Initialize all bitlengths at 0. */
  for (i = 0; i < n; i++) {
    bitlengths[i] = 0;
  }

  /* Count used symbols and place them in the leaves. */
  for (i = 0; i < n; i++) {
    if (frequencies[i]) {
      leaves[numsymbols].weight = frequencies[i];
      leaves[numsymbols].count = i;  /* Index of symbol this leaf represents. */
      numsymbols++;
    }
  }

  /* Check special cases and error conditions. */
  if ((1 << maxbits) < numsymbols) {
    free(leaves);
    return 1;  /* Error, too few maxbits to represent symbols. */
  }
  if (numsymbols == 0) {
    free(leaves);
    return 0;  /* No symbols at all. OK. */
  }
  if (numsymbols == 1) {
    bitlengths[leaves[0].count] = 1;
    free(leaves);
    return 0;  /* Only one symbol, give it bitlength 1, not 0. OK. */
  }
  if (numsymbols == 2) {
    bitlengths[leaves[0].count]++;
    bitlengths[leaves[1].count]++;
    free(leaves);
    return 0;
  }

  /* Sort the leaves from lightest to heaviest. Add count into the same
  variable for stable sorting. */
  for (i = 0; i < numsymbols; i++) {
    if (leaves[i].weight >=
        ((size_t)1 << (sizeof(leaves[0].weight) * CHAR_BIT - 9))) {
      free(leaves);
      return 1;  /* Error, we need 9 bits for the count. */
    }
    leaves[i].weight = (leaves[i].weight << 9) | leaves[i].count;
  }
  qsort(leaves, numsymbols, sizeof(Node), LeafComparator);
  for (i = 0; i < numsymbols; i++) {
    leaves[i].weight >>= 9;
  }

  if (numsymbols - 1 < maxbits) {
    maxbits = numsymbols - 1;
  }

  /* Initialize node memory pool. */
  nodes = (Node*)malloc(maxbits * 2 * numsymbols * sizeof(Node));
  pool.next = nodes;

  lists = (Node* (*)[2])malloc(maxbits * sizeof(*lists));
  InitLists(&pool, leaves, maxbits, lists);

  /* In the last list, 2 * numsymbols - 2 active chains need to be created. Two
  are already created in the initialization. Each BoundaryPM run creates one. */
  numBoundaryPMRuns = 2 * numsymbols - 4;
  for (i = 0; i < numBoundaryPMRuns - 1; i++) {
    BoundaryPM(lists, leaves, numsymbols, &pool, maxbits - 1);
  }
  BoundaryPMFinal(lists, leaves, numsymbols, &pool, maxbits - 1);

  ExtractBitLengths(lists[maxbits - 1][1], leaves, bitlengths);

  free(lists);
  free(leaves);
  free(nodes);
  return 0;  /* OK. */
}